

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

DdNode * cuddBddIntersectRecur(DdManager *dd,DdNode *f,DdNode *g)

{
  uint *puVar1;
  uint *puVar2;
  DdManager *n;
  DdNode *pDVar3;
  DdNode *tmp;
  uint topg;
  uint topf;
  uint index;
  DdNode *zero;
  DdNode *one;
  DdNode *gnv;
  DdNode *gv;
  DdNode *fnv;
  DdNode *fv;
  DdNode *e;
  DdNode *t;
  DdNode *G;
  DdNode *F;
  DdNode *res;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar3 = dd->one;
  fv = (DdNode *)((ulong)pDVar3 ^ 1);
  dd_local = (DdManager *)fv;
  if (((((f != fv) && (g != fv)) && (f != (DdNode *)((ulong)g ^ 1))) &&
      ((dd_local = (DdManager *)f, f != g && (g != pDVar3)))) &&
     (dd_local = (DdManager *)g, f != pDVar3)) {
    res = g;
    g_local = f;
    if ((*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)g & 1)) <
        (*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)f & 1))) {
      res = f;
      g_local = g;
    }
    dd_local = (DdManager *)cuddCacheLookup2(dd,Cudd_bddIntersect,g_local,res);
    if (dd_local == (DdManager *)0x0) {
      puVar1 = (uint *)((ulong)g_local & 0xfffffffffffffffe);
      puVar2 = (uint *)((ulong)res & 0xfffffffffffffffe);
      if ((uint)dd->perm[*puVar2] < (uint)dd->perm[*puVar1]) {
        topg = *puVar2;
        gv = g_local;
        fnv = g_local;
      }
      else {
        topg = *puVar1;
        fnv = *(DdNode **)(puVar1 + 4);
        gv = *(DdNode **)(puVar1 + 6);
        if (((ulong)g_local & 1) != 0) {
          fnv = (DdNode *)((ulong)fnv ^ 1);
          gv = (DdNode *)((ulong)gv ^ 1);
        }
      }
      if ((uint)dd->perm[*puVar1] < (uint)dd->perm[*puVar2]) {
        one = res;
        gnv = res;
      }
      else {
        gnv = *(DdNode **)(puVar2 + 4);
        one = *(DdNode **)(puVar2 + 6);
        if (((ulong)res & 1) != 0) {
          gnv = (DdNode *)((ulong)gnv ^ 1);
          one = (DdNode *)((ulong)one ^ 1);
        }
      }
      n = (DdManager *)cuddBddIntersectRecur(dd,fnv,gnv);
      if (n == (DdManager *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
        if ((n == (DdManager *)fv) && (fv = cuddBddIntersectRecur(dd,gv,one), fv == (DdNode *)0x0))
        {
          Cudd_IterDerefBdd(dd,(DdNode *)n);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)fv & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)fv & 0xfffffffffffffffe) + 4) + 1;
          F = (DdNode *)n;
          if (n != (DdManager *)fv) {
            if (((ulong)n & 1) == 0) {
              F = cuddUniqueInter(dd,topg,(DdNode *)n,fv);
              if (F == (DdNode *)0x0) {
                Cudd_IterDerefBdd(dd,(DdNode *)n);
                Cudd_IterDerefBdd(dd,fv);
                return (DdNode *)0x0;
              }
            }
            else {
              pDVar3 = cuddUniqueInter(dd,topg,(DdNode *)((ulong)n ^ 1),(DdNode *)((ulong)fv ^ 1));
              if (pDVar3 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(dd,(DdNode *)n);
                Cudd_IterDerefBdd(dd,fv);
                return (DdNode *)0x0;
              }
              F = (DdNode *)((ulong)pDVar3 ^ 1);
            }
          }
          *(int *)(((ulong)fv & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)fv & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert2(dd,Cudd_bddIntersect,g_local,res,F);
          dd_local = (DdManager *)F;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddBddIntersectRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res;
    DdNode *F, *G, *t, *e;
    DdNode *fv, *fnv, *gv, *gnv;
    DdNode *one, *zero;
    unsigned int index, topf, topg;

    statLine(dd);
    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == g || g == one) return(f);
    if (f == one) return(g);

    /* At this point f and g are not constant. */
    if (cuddF2L(f) > cuddF2L(g)) { DdNode *tmp = f; f = g; g = tmp; }
    res = cuddCacheLookup2(dd,Cudd_bddIntersect,f,g);
    if (res != NULL) return(res);

    /* Find splitting variable. Here we can skip the use of cuddI,
    ** because the operands are known to be non-constant.
    */
    F = Cudd_Regular(f);
    topf = dd->perm[F->index];
    G = Cudd_Regular(g);
    topg = dd->perm[G->index];

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg <= topf) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    /* Compute partial results. */
    t = cuddBddIntersectRecur(dd,fv,gv);
    if (t == NULL) return(NULL);
    cuddRef(t);
    if (t != zero) {
        e = zero;
    } else {
        e = cuddBddIntersectRecur(dd,fnv,gnv);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
    }
    cuddRef(e);

    if (t == e) { /* both equal zero */
        res = t;
    } else if (Cudd_IsComplement(t)) {
        res = cuddUniqueInter(dd,(int)index,Cudd_Not(t),Cudd_Not(e));
        if (res == NULL) {
            Cudd_IterDerefBdd(dd, t);
            Cudd_IterDerefBdd(dd, e);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = cuddUniqueInter(dd,(int)index,t,e);
        if (res == NULL) {
            Cudd_IterDerefBdd(dd, t);
            Cudd_IterDerefBdd(dd, e);
            return(NULL);
        }
    }
    cuddDeref(e);
    cuddDeref(t);

    cuddCacheInsert2(dd,Cudd_bddIntersect,f,g,res);

    return(res);

}